

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

bool __thiscall rlist::listInsertNode(rlist *this,void *node,unsigned_long pos)

{
  Rlist *pRVar1;
  listNode *plVar2;
  listNode *plVar3;
  listNode *plVar4;
  uint uVar5;
  ulong uVar6;
  listNode *plVar7;
  
  this->length = 0;
  pRVar1 = this->rl;
  plVar4 = pRVar1->head;
  if (plVar4 == (listNode *)0x0) {
    pRVar1->len = 0;
    if (pos != 0) {
      return false;
    }
    this->view = (listNode *)0x0;
    pRVar1->head = (listNode *)node;
  }
  else {
    uVar6 = 0;
    plVar7 = plVar4;
    do {
      uVar6 = uVar6 + 1;
      plVar7 = plVar7->next;
    } while (plVar7 != (listNode *)0x0);
    this->view = (listNode *)0x0;
    this->length = uVar6;
    pRVar1->len = uVar6;
    if (pos < uVar6) {
      this->view = plVar4;
      if (pos != 1) {
        uVar5 = 2;
        do {
          plVar4 = plVar4->next;
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar6 != pos);
        this->view = plVar4;
      }
      plVar7 = plVar4->next;
      *(listNode **)((long)node + 8) = plVar7;
      *(listNode **)node = plVar4;
      plVar7->prev = (listNode *)node;
      plVar4->next = (listNode *)node;
    }
    else {
      if (uVar6 != pos) {
        return false;
      }
      plVar7 = plVar4->next;
      plVar3 = plVar4;
      while (plVar2 = plVar4, plVar7 != (listNode *)0x0) {
        plVar7 = plVar2->next;
        plVar4 = plVar7;
        plVar3 = plVar2;
      }
      this->view = plVar3;
      plVar3->next = (listNode *)node;
      *(listNode **)node = plVar3;
      *(undefined8 *)((long)node + 8) = 0;
    }
  }
  return true;
}

Assistant:

unsigned long rlist::listLength(){
    length=0;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=nullptr){
            length++;
            view=view->next;
        }
    } 
    return rl->len=length;
}